

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O1

void __thiscall
duckdb::WindowLastValueExecutor::EvaluateInternal
          (WindowLastValueExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,DataChunk *eval_chunk,Vector *result,idx_t count,
          idx_t row_idx)

{
  WindowExcludeMode WVar1;
  ulong uVar2;
  WindowExecutorGlobalState *this_00;
  FrameBounds *frame;
  const_reference pvVar3;
  reference pvVar4;
  ulong uVar5;
  WindowCursor *pWVar6;
  pointer pWVar7;
  idx_t row_idx_00;
  int iVar8;
  WindowExecutorLocalState *pWVar9;
  ulong uVar10;
  size_type sVar11;
  long lVar12;
  ulong uVar13;
  size_type __n;
  idx_t target_offset;
  bool bVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  idx_t local_88;
  WindowExecutorLocalState *local_80;
  Vector *local_78;
  WindowExecutorGlobalState *local_70;
  type local_68;
  data_ptr_t local_60;
  data_ptr_t local_58;
  data_ptr_t local_50;
  data_ptr_t local_48;
  idx_t local_40;
  WindowExecutor *local_38;
  
  local_68 = unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::
             operator*(&lstate[0x15].range_cursor);
  pWVar9 = lstate + 2;
  local_80 = lstate;
  optional_ptr<duckdb::ValidityMask,_true>::CheckValid
            ((optional_ptr<duckdb::ValidityMask,_true> *)&gstate[2].executor);
  local_38 = gstate[2].executor;
  WVar1 = gstate->executor->wexpr->exclude_clause;
  local_70 = gstate;
  pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar9,6);
  local_48 = pvVar3->data;
  pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar9,7);
  local_50 = pvVar3->data;
  pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar9,2);
  local_58 = pvVar3->data;
  pvVar3 = vector<duckdb::Vector,_true>::operator[]((vector<duckdb::Vector,_true> *)pWVar9,3);
  if (count != 0) {
    pWVar9 = local_80 + 0x14;
    local_60 = pvVar3->data;
    local_70 = (WindowExecutorGlobalState *)&local_70[2].partition_mask;
    target_offset = 0;
    local_78 = result;
    local_40 = count;
    do {
      uVar13 = *(ulong *)(local_48 + target_offset * 8);
      uVar2 = *(ulong *)(local_50 + target_offset * 8);
      if (WVar1 == NO_OTHER) {
        sVar11 = 0;
      }
      else {
        uVar5 = row_idx;
        if (WVar1 != CURRENT_ROW) {
          uVar5 = *(ulong *)(local_58 + target_offset * 8);
        }
        if (uVar2 <= uVar5) {
          uVar5 = uVar2;
        }
        if (uVar5 <= uVar13) {
          uVar5 = uVar13;
        }
        pvVar4 = vector<duckdb::FrameBounds,_true>::operator[]
                           ((vector<duckdb::FrameBounds,_true> *)pWVar9,0);
        pvVar4->start = uVar13;
        pvVar4->end = uVar5;
        sVar11 = 1;
        if (WVar1 == TIES) {
          uVar5 = uVar13;
          if (uVar13 < row_idx) {
            uVar5 = row_idx;
          }
          if (uVar2 <= uVar5) {
            uVar5 = uVar2;
          }
          uVar10 = row_idx + 1;
          if (uVar2 <= row_idx + 1) {
            uVar10 = uVar2;
          }
          if (uVar10 <= uVar13) {
            uVar10 = uVar13;
          }
          pvVar4 = vector<duckdb::FrameBounds,_true>::operator[]
                             ((vector<duckdb::FrameBounds,_true> *)pWVar9,1);
          pvVar4->start = uVar5;
          pvVar4->end = uVar10;
          sVar11 = 2;
        }
        if (WVar1 == CURRENT_ROW) {
          uVar5 = row_idx + 1;
        }
        else {
          uVar5 = *(ulong *)(local_60 + target_offset * 8);
        }
        if (uVar13 < uVar5) {
          uVar13 = uVar5;
        }
        result = local_78;
        if (uVar2 <= uVar13) {
          uVar13 = uVar2;
        }
      }
      pvVar4 = vector<duckdb::FrameBounds,_true>::operator[]
                         ((vector<duckdb::FrameBounds,_true> *)pWVar9,sVar11);
      this_00 = local_70;
      pvVar4->start = uVar13;
      pvVar4->end = uVar2;
      if (*(ValidityMask **)local_70 == (ValidityMask *)0x0) {
        lVar12 = (long)local_80[0x14].range_cursor.
                       super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                       ._M_t.
                       super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
                       .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl -
                 (long)local_80[0x14].super_WindowExecutorState._vptr_WindowExecutorState;
        if (lVar12 != 0) {
          bVar14 = false;
          sVar11 = lVar12 >> 4;
          do {
            __n = sVar11 - 1;
            pvVar4 = vector<duckdb::FrameBounds,_true>::operator[]
                               ((vector<duckdb::FrameBounds,_true> *)pWVar9,__n);
            iVar8 = 5;
            if (pvVar4->start < pvVar4->end) {
              local_88 = 1;
              row_idx_00 = WindowBoundariesState::FindPrevStart
                                     ((ValidityMask *)local_38,pvVar4->start,pvVar4->end,&local_88);
              iVar8 = 0;
              if (local_88 == 0) {
                WindowCursor::CopyCell(local_68,0,row_idx_00,result,target_offset);
                iVar8 = 1;
              }
            }
            if ((iVar8 != 5) && (iVar8 != 0)) {
              if (!bVar14) goto LAB_011cc200;
              break;
            }
            bVar14 = sVar11 == 1;
            sVar11 = __n;
          } while (__n != 0);
        }
LAB_011cc1f0:
        FlatVector::SetNull(result,target_offset,true);
      }
      else {
        lVar12 = 0;
        for (pWVar6 = (WindowCursor *)
                      local_80[0x14].super_WindowExecutorState._vptr_WindowExecutorState;
            pWVar6 != local_80[0x14].range_cursor.
                      super_unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                      ._M_t.
                      super___uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::WindowCursor_*,_std::default_delete<duckdb::WindowCursor>_>
                      .super__Head_base<0UL,_duckdb::WindowCursor_*,_false>._M_head_impl;
            pWVar6 = (WindowCursor *)((long)&(pWVar6->state).current_chunk_state + 8)) {
          lVar12 = *(long *)&(pWVar6->state).current_chunk_state.handles +
                   (lVar12 - (long)pWVar6->paged);
        }
        if (lVar12 == 0) goto LAB_011cc1f0;
        uVar13 = lVar12 + -1;
        pWVar7 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                 ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                               *)local_70);
        pVar15 = WindowIndexTree::SelectNth(pWVar7,(SubFrames *)pWVar9,uVar13);
        if (pVar15.second - 1 < uVar13) {
          pWVar7 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                   ::operator->((unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
                                 *)this_00);
          pVar15 = WindowIndexTree::SelectNth(pWVar7,(SubFrames *)pWVar9,uVar13 - pVar15.second);
        }
        if (pVar15.second != 0) goto LAB_011cc1f0;
        WindowCursor::CopyCell(local_68,0,pVar15.first,result,target_offset);
      }
LAB_011cc200:
      target_offset = target_offset + 1;
      row_idx = row_idx + 1;
    } while (target_offset != local_40);
  }
  return;
}

Assistant:

void WindowLastValueExecutor::EvaluateInternal(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                               DataChunk &eval_chunk, Vector &result, idx_t count,
                                               idx_t row_idx) const {
	auto &gvstate = gstate.Cast<WindowValueGlobalState>();
	auto &lvstate = lstate.Cast<WindowValueLocalState>();
	auto &cursor = *lvstate.cursor;
	auto &bounds = lvstate.bounds;
	auto &frames = lvstate.frames;
	auto &ignore_nulls = *gvstate.ignore_nulls;
	auto exclude_mode = gvstate.executor.wexpr.exclude_clause;
	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t i) {
		if (gvstate.value_tree) {
			idx_t frame_width = 0;
			for (const auto &frame : frames) {
				frame_width += frame.end - frame.start;
			}

			if (frame_width) {
				auto n = frame_width - 1;
				auto last_idx = gvstate.value_tree->SelectNth(frames, n);
				if (last_idx.second && last_idx.second <= n) {
					//	Frame larger than data. Since we want last, we back off by the overflow
					n -= last_idx.second;
					last_idx = gvstate.value_tree->SelectNth(frames, n);
				}
				if (last_idx.second) {
					//	No last value - give up.
					FlatVector::SetNull(result, i, true);
				} else {
					cursor.CopyCell(0, last_idx.first, result, i);
				}
			} else {
				FlatVector::SetNull(result, i, true);
			}
			return;
		}

		for (idx_t f = frames.size(); f-- > 0;) {
			const auto &frame = frames[f];
			if (frame.start >= frame.end) {
				continue;
			}

			idx_t n = 1;
			const auto last_idx = WindowBoundariesState::FindPrevStart(ignore_nulls, frame.start, frame.end, n);
			if (!n) {
				cursor.CopyCell(0, last_idx, result, i);
				return;
			}
		}

		// Didn't find one
		FlatVector::SetNull(result, i, true);
	});
}